

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerSlotArrayCheck(Lowerer *this,Instr *instr)

{
  SymID SVar1;
  Instr *pIVar2;
  Instr *insertBeforeInstr;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  IntConstOpnd *this_00;
  long lVar8;
  undefined4 *puVar9;
  StackSym *pSVar10;
  LabelInstr *instr_00;
  LabelInstr *target;
  IndirOpnd *pIVar11;
  Instr *instr_01;
  Instr *instrHelper;
  IndirOpnd *indirOpnd;
  LabelInstr *continueLabel;
  LabelInstr *errorLabel;
  RegOpnd *dstOpnd;
  IndirOpnd *srcOpnd;
  uint32 slotId;
  IntConstOpnd *slotIdOpnd;
  StackSym *stackSym;
  RegOpnd *slotArrayOpnd;
  Instr *insertInstr;
  Instr *instrPrev;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar2 = instr->m_prev;
  insertBeforeInstr = instr->m_next;
  pOVar6 = IR::Instr::GetDst(instr);
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
  slotIdOpnd = (IntConstOpnd *)pRVar7->m_sym;
  pOVar6 = IR::Instr::UnlinkSrc2(instr);
  this_00 = IR::Opnd::AsIntConstOpnd(pOVar6);
  lVar8 = IR::EncodableOpnd<long>::GetValue(&this_00->super_EncodableOpnd<long>);
  uVar5 = (uint)lVar8;
  if ((uVar5 == 0xffffffff) || (uVar5 < 2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6fcc,"(slotId != (uint32)-1 && slotId >= Js::ScopeSlots::FirstSlotIndex)",
                       "slotId != (uint32)-1 && slotId >= Js::ScopeSlots::FirstSlotIndex");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (2 < uVar5) {
    bVar4 = Func::DoStackFrameDisplay(this->m_func);
    if ((bVar4) &&
       (SVar1 = (((StackSym *)slotIdOpnd)->super_Sym).m_id,
       pSVar10 = Func::GetLocalClosureSym(this->m_func), SVar1 == (pSVar10->super_Sym).m_id)) {
      pRVar7 = IR::RegOpnd::New((StackSym *)slotIdOpnd,TyVar,this->m_func);
      pIVar11 = IR::IndirOpnd::New(pRVar7,0,TyVar,this->m_func,false);
      pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
      InsertMove(&pRVar7->super_Opnd,&pIVar11->super_Opnd,insertBeforeInstr,true);
      slotIdOpnd = (IntConstOpnd *)pRVar7->m_sym;
    }
    instr_00 = IR::LabelInstr::New(Label,this->m_func,true);
    target = IR::LabelInstr::New(Label,this->m_func,false);
    pRVar7 = IR::RegOpnd::New((StackSym *)slotIdOpnd,TyVar,this->m_func);
    pIVar11 = IR::IndirOpnd::New(pRVar7,0,TyVar,this->m_func,true);
    IR::IntConstOpnd::SetValue(this_00,(ulong)(uVar5 - 2));
    InsertCompareBranch(this,&pIVar11->super_Opnd,&this_00->super_Opnd,BrGt_A,true,target,
                        insertBeforeInstr,false);
    IR::Instr::InsertBefore(insertBeforeInstr,&instr_00->super_Instr);
    instr_01 = IR::Instr::New(Call,this->m_func);
    IR::Instr::InsertBefore(insertBeforeInstr,instr_01);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr_01,HelperOp_FatalInternalError,(LabelInstr *)0x0,(Opnd *)0x0
               ,(PropertySymOpnd *)0x0,false);
    IR::Instr::InsertBefore(insertBeforeInstr,&target->super_Instr);
  }
  LowererMD::ChangeToAssign(instr);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerSlotArrayCheck(IR::Instr * instr)
{
    IR::Instr *instrPrev = instr->m_prev;
    IR::Instr *insertInstr = instr->m_next;

    IR::RegOpnd *slotArrayOpnd = instr->GetDst()->AsRegOpnd();
    StackSym *stackSym = slotArrayOpnd->m_sym;

    IR::IntConstOpnd *slotIdOpnd = instr->UnlinkSrc2()->AsIntConstOpnd();
    uint32 slotId = (uint32)slotIdOpnd->GetValue();
    Assert(slotId != (uint32)-1 && slotId >= Js::ScopeSlots::FirstSlotIndex);

    if (slotId > Js::ScopeSlots::FirstSlotIndex)
    {
        if (m_func->DoStackFrameDisplay() && stackSym->m_id == m_func->GetLocalClosureSym()->m_id)
        {
            // The pointer we loaded points to the reserved/known address where the slot array can be boxed.
            // Deref to get the real value.
            IR::IndirOpnd * srcOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(stackSym, TyVar, m_func), 0, TyVar, m_func);
            IR::RegOpnd * dstOpnd = IR::RegOpnd::New(TyVar, m_func);
            InsertMove(dstOpnd, srcOpnd, insertInstr);
            stackSym = dstOpnd->m_sym;
        }

        IR::LabelInstr *errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        IR::LabelInstr *continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(stackSym, TyVar, m_func),
                                                       Js::ScopeSlots::EncodedSlotCountSlotIndex * sizeof(Js::Var),
                                                       TyVar, m_func, true);

        slotIdOpnd->SetValue(slotId - Js::ScopeSlots::FirstSlotIndex);
        InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrGt_A, true, continueLabel, insertInstr);

        insertInstr->InsertBefore(errorLabel);
        IR::Instr * instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
        insertInstr->InsertBefore(instrHelper);
        m_lowererMD.ChangeToHelperCall(instrHelper, IR::HelperOp_FatalInternalError);
        insertInstr->InsertBefore(continueLabel);
    }

    m_lowererMD.ChangeToAssign(instr);

    return instrPrev;
}